

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

bool __thiscall
spirv_cross::CompilerMSL::emit_tessellation_access_chain
          (CompilerMSL *this,uint32_t *ops,uint32_t length)

{
  IVariant *pIVar1;
  __node_base_ptr args_1;
  bool bVar2;
  ExecutionModel EVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  SPIRType *pSVar6;
  VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *pVVar7;
  CompilerError *this_00;
  uint *puVar8;
  size_t sVar9;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *this_01;
  SPIRConstant *pSVar10;
  TypedID *pTVar11;
  char *pcVar12;
  SPIREntryPoint *pSVar13;
  mapped_type *pmVar14;
  mapped_type *this_02;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar15;
  VariableID *local_278;
  bool local_25b;
  bool local_25a;
  bool local_259;
  byte local_24d;
  TypedID<(spirv_cross::Types)0> local_24c;
  TypedID<(spirv_cross::Types)0> local_248;
  TypedID<(spirv_cross::Types)1> local_244;
  SPIRVariable *local_240;
  SPIRVariable *dest_var;
  SPIRConstant *c_1;
  Meta *local_228;
  Meta *m;
  _Node_iterator_base<unsigned_int,_false> _Stack_218;
  uint32_t i_2;
  undefined1 local_210;
  _Node_iterator_base<unsigned_int,_false> local_208;
  undefined1 local_200;
  ID local_1f8;
  bool local_1f1;
  SPIRExpression *local_1f0;
  SPIRExpression *expr;
  SPIRType *pSStack_1e0;
  uint32_t i_1;
  SPIRType *expr_type;
  undefined1 local_1b8 [32];
  undefined1 local_198 [64];
  SPIRExpression *local_158;
  SPIRExpression *ptr_expr;
  string local_130 [8];
  string e;
  bool local_109;
  uint32_t local_108;
  bool local_101;
  uint32_t local_100;
  char local_fa;
  allocator local_f9;
  string local_f8 [32];
  SPIRConstant *local_d8;
  SPIRConstant *c;
  __node_base local_c8;
  SPIRType *type;
  uint32_t i;
  uint32_t local_b4;
  uint32_t index;
  uint32_t const_mbr_id;
  SPIRType *result_ptr_type;
  VariableID ptr;
  VariableID stage_var_id;
  uint32_t first_non_array_index;
  undefined1 local_88 [4];
  uint32_t next_id;
  SmallVector<unsigned_int,_8UL> indices;
  byte local_48;
  byte local_47;
  byte local_46;
  AccessChainMeta meta;
  TypedID<(spirv_cross::Types)0> local_3c;
  BuiltIn bi_type;
  byte local_34;
  byte local_33;
  bool local_32;
  bool local_31;
  bool multi_patch;
  bool ptr_is_chain;
  bool flat_data;
  SPIRVariable *pSStack_30;
  bool patch;
  SPIRVariable *var;
  __node_base_ptr p_Stack_20;
  uint32_t length_local;
  uint32_t *ops_local;
  CompilerMSL *this_local;
  
  var._4_4_ = length;
  p_Stack_20 = (__node_base_ptr)ops;
  ops_local = (uint32_t *)this;
  pSStack_30 = Compiler::maybe_get_backing_variable((Compiler *)this,ops[2]);
  local_31 = false;
  local_32 = false;
  local_33 = 0;
  EVar3 = Compiler::get_execution_model((Compiler *)this);
  local_24d = 0;
  if (EVar3 == ExecutionModelTessellationControl) {
    local_24d = (this->msl_options).multi_patch_workgroup;
  }
  local_34 = local_24d & 1;
  if (pSStack_30 != (SPIRVariable *)0x0) {
    TypedID<(spirv_cross::Types)0>::TypedID
              ((TypedID<(spirv_cross::Types)0> *)&bi_type,*(uint32_t *)&p_Stack_20[1]._M_nxt);
    bVar2 = Compiler::has_decoration((Compiler *)this,(ID)bi_type,DecorationPatch);
    local_259 = true;
    if (!bVar2) {
      pSVar6 = Compiler::get_variable_data_type((Compiler *)this,pSStack_30);
      local_259 = is_patch_block(this,pSVar6);
    }
    local_31 = local_259;
    local_25a = true;
    if (pSStack_30->storage != StorageClassInput) {
      local_25b = false;
      if (pSStack_30->storage == StorageClassOutput) {
        EVar3 = Compiler::get_execution_model((Compiler *)this);
        local_25b = EVar3 == ExecutionModelTessellationControl;
      }
      local_25a = local_25b;
    }
    local_32 = local_25a;
    pIVar1 = &pSStack_30->super_IVariant;
    TypedID<(spirv_cross::Types)0>::TypedID(&local_3c,*(uint32_t *)&p_Stack_20[1]._M_nxt);
    local_33 = TypedID<(spirv_cross::Types)0>::operator!=(&pIVar1->self,&local_3c);
  }
  TypedID<(spirv_cross::Types)0>::TypedID
            ((TypedID<(spirv_cross::Types)0> *)&meta,*(uint32_t *)&p_Stack_20[1]._M_nxt);
  meta._4_4_ = Compiler::get_decoration
                         ((Compiler *)this,(ID)meta.storage_physical_type,DecorationBuiltIn);
  if ((((pSStack_30 == (SPIRVariable *)0x0) || ((local_32 & 1U) == 0)) || ((local_31 & 1U) != 0)) ||
     ((((bVar2 = Compiler::is_builtin_variable((Compiler *)this,pSStack_30), bVar2 &&
        (meta._4_4_ != 0)) && ((meta._4_4_ != 1 && ((meta._4_4_ != 3 && (meta._4_4_ != 4)))))) &&
      (pSVar6 = Compiler::get_variable_data_type((Compiler *)this,pSStack_30),
      *(int *)&(pSVar6->super_IVariant).field_0xc != 0xf)))) {
    if (pSStack_30 == (SPIRVariable *)0x0) {
      TypedID<(spirv_cross::Types)0>::TypedID((TypedID<(spirv_cross::Types)0> *)((long)&c_1 + 4),0);
    }
    else {
      c_1._4_4_ = (pSStack_30->super_IVariant).self.id;
    }
    local_228 = ParsedIR::find_meta(&(this->super_CompilerGLSL).super_Compiler.ir,c_1._4_4_);
    EVar3 = Compiler::get_execution_model((Compiler *)this);
    if ((((EVar3 == ExecutionModelTessellationControl) && (pSStack_30 != (SPIRVariable *)0x0)) &&
        (local_228 != (Meta *)0x0)) &&
       ((local_228->decoration).builtin_type == BuiltInTessLevelInner)) {
      pSVar13 = Compiler::get_entry_point((Compiler *)this);
      bVar2 = Bitset::get(&pSVar13->flags,0x16);
      if (bVar2) {
        dest_var = (SPIRVariable *)
                   Compiler::maybe_get<spirv_cross::SPIRConstant>
                             ((Compiler *)this,*(uint32_t *)((long)&p_Stack_20[1]._M_nxt + 4));
        if (((SPIRConstant *)dest_var == (SPIRConstant *)0x0) ||
           (uVar4 = SPIRConstant::scalar((SPIRConstant *)dest_var,0,0), uVar4 != 1)) {
          local_240 = Compiler::set<spirv_cross::SPIRVariable,spirv_cross::SPIRVariable&>
                                ((Compiler *)this,*(uint32_t *)((long)&p_Stack_20->_M_nxt + 4),
                                 pSStack_30);
          TypedID<(spirv_cross::Types)1>::TypedID(&local_244,*(uint32_t *)&p_Stack_20->_M_nxt);
          *(uint32_t *)&(local_240->super_IVariant).field_0xc = local_244.id;
          TypedID<(spirv_cross::Types)0>::TypedID(&local_248,*(uint32_t *)&p_Stack_20[1]._M_nxt);
          pmVar14 = ::std::
                    unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                    ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,&local_248);
          TypedID<(spirv_cross::Types)0>::TypedID
                    (&local_24c,*(uint32_t *)((long)&p_Stack_20->_M_nxt + 4));
          this_02 = ::std::
                    unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
                    ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,&local_24c);
          Meta::operator=(this_02,pmVar14);
          Compiler::inherit_expression_dependencies
                    ((Compiler *)this,*(uint32_t *)((long)&p_Stack_20->_M_nxt + 4),
                     *(uint32_t *)&p_Stack_20[1]._M_nxt);
          this_local._7_1_ = 1;
        }
        else {
          this_local._7_1_ = 0;
        }
        goto LAB_003f309a;
      }
    }
    this_local._7_1_ = 0;
    goto LAB_003f309a;
  }
  AccessChainMeta::AccessChainMeta((AccessChainMeta *)(indices.stack_storage.aligned_char + 0x1c));
  SmallVector<unsigned_int,_8UL>::SmallVector((SmallVector<unsigned_int,_8UL> *)local_88);
  uVar4 = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,1);
  SmallVector<unsigned_int,_8UL>::reserve
            ((SmallVector<unsigned_int,_8UL> *)local_88,(ulong)(var._4_4_ - 2));
  ptr.id = 4;
  if ((local_33 & 1) != 0) {
    ptr.id = 3;
  }
  if (pSStack_30->storage == StorageClassInput) {
    local_278 = &this->stage_in_ptr_var_id;
  }
  else {
    local_278 = &this->stage_out_ptr_var_id;
  }
  result_ptr_type._4_4_ = local_278->id;
  uVar5 = result_ptr_type._4_4_;
  if ((local_33 & 1) != 0) {
    TypedID<(spirv_cross::Types)2>::TypedID
              ((TypedID<(spirv_cross::Types)2> *)&result_ptr_type,*(uint32_t *)&p_Stack_20[1]._M_nxt
              );
    uVar5 = (uint32_t)result_ptr_type;
  }
  result_ptr_type._0_4_ = uVar5;
  if ((local_33 & 1) == 0) {
    SmallVector<unsigned_int,_8UL>::push_back
              ((SmallVector<unsigned_int,_8UL> *)local_88,(uint *)((long)&p_Stack_20[1]._M_nxt + 4))
    ;
  }
  _index = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,*(uint32_t *)&p_Stack_20->_M_nxt);
  local_b4 = uVar4;
  uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_30->super_IVariant).self);
  i = Compiler::get_extended_decoration
                ((Compiler *)this,uVar4,SPIRVCrossDecorationInterfaceMemberIndex);
  if (pSStack_30->storage == StorageClassInput) {
LAB_003f1fbf:
    type._0_4_ = ptr.id;
    local_c8._M_nxt =
         (_Hash_node_base *)Compiler::get_variable_element_type((Compiler *)this,pSStack_30);
    if ((i == 0xffffffff) && (ptr.id + 1 <= var._4_4_)) {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_30->super_IVariant).self);
      TypedID<(spirv_cross::Types)3>::TypedID
                ((TypedID<(spirv_cross::Types)3> *)((long)&c + 4),
                 *(uint32_t *)((long)&p_Stack_20->_M_nxt + (ulong)ptr.id * 4));
      pSVar10 = Compiler::get_constant((Compiler *)this,c._4_4_);
      uVar5 = SPIRConstant::scalar(pSVar10,0,0);
      i = Compiler::get_extended_member_decoration
                    ((Compiler *)this,uVar4,uVar5,SPIRVCrossDecorationInterfaceMemberIndex);
      if (i == 0xffffffff) {
        __assert_fail("index != uint32_t(-1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                      ,0x17b2,
                      "bool spirv_cross::CompilerMSL::emit_tessellation_access_chain(const uint32_t *, uint32_t)"
                     );
      }
      type._0_4_ = (uint)type + 1;
      pVVar7 = (VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)(local_c8._M_nxt + 0x11);
      TypedID<(spirv_cross::Types)3>::TypedID
                ((TypedID<(spirv_cross::Types)3> *)&c,
                 *(uint32_t *)((long)&p_Stack_20->_M_nxt + (ulong)ptr.id * 4));
      pSVar10 = Compiler::get_constant((Compiler *)this,c._0_4_);
      uVar4 = SPIRConstant::scalar(pSVar10,0,0);
      pTVar11 = (TypedID *)
                VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                          (pVVar7,(ulong)uVar4);
      uVar4 = TypedID::operator_cast_to_unsigned_int(pTVar11);
      local_c8._M_nxt =
           (_Hash_node_base *)Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar4);
    }
    while (((uint)type < var._4_4_ &&
           ((((local_34 & 1) == 0 &&
             ((bVar2 = Compiler::is_array((Compiler *)this,(SPIRType *)local_c8._M_nxt), bVar2 ||
              (bVar2 = Compiler::is_matrix((Compiler *)this,(SPIRType *)local_c8._M_nxt), bVar2))))
            || (*(int *)((ID *)(local_c8._M_nxt + 1) + 1) == 0xf))))) {
      local_d8 = Compiler::maybe_get<spirv_cross::SPIRConstant>
                           ((Compiler *)this,
                            *(uint32_t *)((long)&p_Stack_20->_M_nxt + (ulong)(uint)type * 4));
      if ((local_d8 == (SPIRConstant *)0x0) || ((local_d8->specialization & 1U) != 0)) {
        local_fa = '\x01';
        this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_f8,
                   "Trying to dynamically index into an array interface variable in tessellation. This is currently unsupported."
                   ,&local_f9);
        CompilerError::CompilerError(this_00,(string *)local_f8);
        local_fa = '\0';
        __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      uVar4 = SPIRConstant::scalar(local_d8,0,0);
      i = i + uVar4;
      uVar4 = TypedID::operator_cast_to_unsigned_int
                        ((TypedID *)((TypeID *)(local_c8._M_nxt + 0x22) + 1));
      if (uVar4 == 0) {
        if (*(int *)((ID *)(local_c8._M_nxt + 1) + 1) == 0xf) {
          pVVar7 = (VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                   (local_c8._M_nxt + 0x11);
          uVar4 = SPIRConstant::scalar(local_d8,0,0);
          pTVar11 = (TypedID *)
                    VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                              (pVVar7,(ulong)uVar4);
          uVar4 = TypedID::operator_cast_to_unsigned_int(pTVar11);
          local_c8._M_nxt =
               (_Hash_node_base *)Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar4);
        }
      }
      else {
        uVar4 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)((TypeID *)(local_c8._M_nxt + 0x22) + 1));
        local_c8._M_nxt =
             (_Hash_node_base *)Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar4);
      }
      type._0_4_ = (uint)type + 1;
    }
    if ((((local_34 & 1) == 0) &&
        ((bVar2 = Compiler::is_matrix((Compiler *)this,_index), bVar2 ||
         (bVar2 = Compiler::is_array((Compiler *)this,_index), bVar2)))) ||
       (uVar4 = local_b4, *(int *)&(_index->super_IVariant).field_0xc == 0xf)) {
      Compiler::set_extended_decoration
                ((Compiler *)this,*(uint32_t *)((long)&p_Stack_20->_M_nxt + 4),
                 SPIRVCrossDecorationInterfaceMemberIndex,i);
    }
    else {
      local_100 = get_uint_type_id(this);
      local_101 = false;
      Compiler::set<spirv_cross::SPIRConstant,unsigned_int,unsigned_int&,bool>
                ((Compiler *)this,uVar4,&local_100,&i,&local_101);
      SmallVector<unsigned_int,_8UL>::push_back
                ((SmallVector<unsigned_int,_8UL> *)local_88,&local_b4);
      if ((uint)type < var._4_4_) {
        puVar8 = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)local_88);
        SmallVector<unsigned_int,_8UL>::insert
                  ((SmallVector<unsigned_int,_8UL> *)local_88,puVar8,
                   (uint *)((long)&p_Stack_20->_M_nxt + (ulong)(uint)type * 4),
                   (uint *)((long)&p_Stack_20->_M_nxt + (ulong)var._4_4_ * 4));
      }
    }
  }
  else {
    pSVar6 = Compiler::get_variable_element_type((Compiler *)this,pSStack_30);
    type._4_4_ = (pSVar6->super_IVariant).self.id;
    bVar2 = Compiler::has_decoration((Compiler *)this,type._4_4_,DecorationBlock);
    uVar4 = local_b4;
    if (bVar2) goto LAB_003f1fbf;
    if (i == 0xffffffff) {
      __assert_fail("index != uint32_t(-1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_msl.cpp"
                    ,0x17e3,
                    "bool spirv_cross::CompilerMSL::emit_tessellation_access_chain(const uint32_t *, uint32_t)"
                   );
    }
    local_108 = get_uint_type_id(this);
    local_109 = false;
    Compiler::set<spirv_cross::SPIRConstant,unsigned_int,unsigned_int&,bool>
              ((Compiler *)this,uVar4,&local_108,&i,&local_109);
    SmallVector<unsigned_int,_8UL>::push_back((SmallVector<unsigned_int,_8UL> *)local_88,&local_b4);
    puVar8 = VectorView<unsigned_int>::end((VectorView<unsigned_int> *)local_88);
    SmallVector<unsigned_int,_8UL>::insert
              ((SmallVector<unsigned_int,_8UL> *)local_88,puVar8,(uint *)(p_Stack_20 + 2),
               (uint *)((long)&p_Stack_20->_M_nxt + (ulong)var._4_4_ * 4));
  }
  ::std::__cxx11::string::string(local_130);
  uVar4 = (uint32_t)this;
  if ((local_33 & 1) == 0) {
    uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&result_ptr_type);
    puVar8 = VectorView<unsigned_int>::data((VectorView<unsigned_int> *)local_88);
    sVar9 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)local_88);
    CompilerGLSL::access_chain_abi_cxx11_
              ((CompilerGLSL *)&ptr_expr,uVar4,(uint32_t *)(ulong)uVar5,(uint32_t)puVar8,
               (SPIRType *)(sVar9 & 0xffffffff),(AccessChainMeta *)_index,
               (bool)((char)&indices + '4'));
    ::std::__cxx11::string::operator=(local_130,(string *)&ptr_expr);
    ::std::__cxx11::string::~string((string *)&ptr_expr);
  }
  else {
    uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&result_ptr_type);
    local_158 = Compiler::maybe_get<spirv_cross::SPIRExpression>((Compiler *)this,uVar5);
    if ((local_158 == (SPIRExpression *)0x0) ||
       (sVar9 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::size
                          (&(local_158->implied_read_expressions).
                            super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>),
       sVar9 != 2)) {
      uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&result_ptr_type);
      puVar8 = VectorView<unsigned_int>::data((VectorView<unsigned_int> *)local_88);
      sVar9 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)local_88);
      CompilerGLSL::access_chain_internal_abi_cxx11_
                ((CompilerGLSL *)&expr_type,uVar4,(uint32_t *)(ulong)uVar5,(uint32_t)puVar8,
                 (AccessChainFlags)sVar9,(AccessChainMeta *)0x0);
      ::std::__cxx11::string::operator=(local_130,(string *)&expr_type);
      ::std::__cxx11::string::~string((string *)&expr_type);
    }
    else {
      uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&result_ptr_type);
      CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_198,uVar4,SUB41(uVar5,0));
      uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)((long)&result_ptr_type + 4));
      puVar8 = VectorView<unsigned_int>::data((VectorView<unsigned_int> *)local_88);
      sVar9 = VectorView<unsigned_int>::size((VectorView<unsigned_int> *)local_88);
      CompilerGLSL::access_chain_internal_abi_cxx11_
                ((CompilerGLSL *)local_1b8,uVar4,(uint32_t *)(ulong)uVar5,(uint32_t)puVar8,
                 (AccessChainFlags)sVar9,(AccessChainMeta *)0x2);
      join<std::__cxx11::string,std::__cxx11::string>
                ((spirv_cross *)(local_198 + 0x20),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
      ::std::__cxx11::string::operator=(local_130,(string *)(local_198 + 0x20));
      ::std::__cxx11::string::~string((string *)(local_198 + 0x20));
      ::std::__cxx11::string::~string((string *)local_1b8);
      ::std::__cxx11::string::~string((string *)local_198);
    }
  }
  pSStack_1e0 = Compiler::get_variable_data_type((Compiler *)this,pSStack_30);
  bVar2 = Compiler::has_extended_decoration
                    ((Compiler *)this,*(uint32_t *)&p_Stack_20[1]._M_nxt,
                     SPIRVCrossDecorationTessIOOriginalInputTypeID);
  if (bVar2) {
    uVar4 = Compiler::get_extended_decoration
                      ((Compiler *)this,*(uint32_t *)&p_Stack_20[1]._M_nxt,
                       SPIRVCrossDecorationTessIOOriginalInputTypeID);
    pSStack_1e0 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar4);
  }
  for (expr._4_4_ = 3; expr._4_4_ < var._4_4_; expr._4_4_ = expr._4_4_ + 1) {
    bVar2 = Compiler::is_array((Compiler *)this,pSStack_1e0);
    if ((bVar2) || (*(int *)&(pSStack_1e0->super_IVariant).field_0xc != 0xf)) {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_1e0->parent_type);
      pSStack_1e0 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar4);
    }
    else {
      this_01 = &pSStack_1e0->member_types;
      pSVar10 = Compiler::get<spirv_cross::SPIRConstant>
                          ((Compiler *)this,
                           *(uint32_t *)((long)&p_Stack_20->_M_nxt + (ulong)expr._4_4_ * 4));
      uVar4 = SPIRConstant::scalar(pSVar10,0,0);
      pTVar11 = (TypedID *)
                VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                          (&this_01->super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                           (ulong)uVar4);
      uVar4 = TypedID::operator_cast_to_unsigned_int(pTVar11);
      pSStack_1e0 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar4);
    }
  }
  bVar2 = Compiler::is_array((Compiler *)this,pSStack_1e0);
  if ((((!bVar2) && (bVar2 = Compiler::is_matrix((Compiler *)this,pSStack_1e0), !bVar2)) &&
      (*(int *)&(pSStack_1e0->super_IVariant).field_0xc != 0xf)) &&
     (_index->vecsize < pSStack_1e0->vecsize)) {
    pcVar12 = CompilerGLSL::vector_swizzle(_index->vecsize,0);
    ::std::__cxx11::string::operator+=(local_130,pcVar12);
  }
  args_1 = p_Stack_20;
  uVar4 = *(uint32_t *)((long)&p_Stack_20->_M_nxt + 4);
  local_1f1 = CompilerGLSL::should_forward
                        (&this->super_CompilerGLSL,*(uint32_t *)&p_Stack_20[1]._M_nxt);
  local_1f0 = Compiler::
              set<spirv_cross::SPIRExpression,std::__cxx11::string,unsigned_int_const&,bool>
                        ((Compiler *)this,uVar4,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_130,(uint *)args_1,&local_1f1);
  (local_1f0->loaded_from).id = (pSStack_30->super_IVariant).self.id;
  local_1f0->need_transpose = (bool)(local_48 & 1);
  local_1f0->access_chain = true;
  if ((local_47 & 1) != 0) {
    Compiler::set_extended_decoration
              ((Compiler *)this,*(uint32_t *)((long)&p_Stack_20->_M_nxt + 4),
               SPIRVCrossDecorationPhysicalTypePacked,0);
  }
  if (indices.stack_storage.aligned_char._28_4_ != 0) {
    Compiler::set_extended_decoration
              ((Compiler *)this,*(uint32_t *)((long)&p_Stack_20->_M_nxt + 4),
               SPIRVCrossDecorationPhysicalTypeID,indices.stack_storage.aligned_char._28_4_);
  }
  if ((local_46 & 1) != 0) {
    TypedID<(spirv_cross::Types)0>::TypedID(&local_1f8,*(uint32_t *)((long)&p_Stack_20->_M_nxt + 4))
    ;
    Compiler::set_decoration((Compiler *)this,local_1f8,DecorationInvariant,0);
  }
  uVar4 = *(uint32_t *)((long)&p_Stack_20->_M_nxt + 4);
  uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_1e0->super_IVariant).self);
  Compiler::set_extended_decoration
            ((Compiler *)this,uVar4,SPIRVCrossDecorationTessIOOriginalInputTypeID,uVar5);
  pVar15 = ::std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::insert(&(this->super_CompilerGLSL).super_Compiler.forwarded_temporaries,
                    (value_type *)((long)&p_Stack_20->_M_nxt + 4));
  local_208._M_cur =
       (__node_type *)pVar15.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
  local_200 = pVar15.second;
  pVar15 = ::std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::insert(&(this->super_CompilerGLSL).super_Compiler.suppressed_usage_tracking,
                    (value_type *)((long)&p_Stack_20->_M_nxt + 4));
  _Stack_218._M_cur =
       (__node_type *)pVar15.first.super__Node_iterator_base<unsigned_int,_false>._M_cur;
  local_210 = pVar15.second;
  for (m._4_4_ = 2; m._4_4_ < var._4_4_; m._4_4_ = m._4_4_ + 1) {
    Compiler::inherit_expression_dependencies
              ((Compiler *)this,*(uint32_t *)((long)&p_Stack_20->_M_nxt + 4),
               *(uint32_t *)((long)&p_Stack_20->_M_nxt + (ulong)m._4_4_ * 4));
    Compiler::add_implied_read_expression
              ((Compiler *)this,local_1f0,
               *(uint32_t *)((long)&p_Stack_20->_M_nxt + (ulong)m._4_4_ * 4));
  }
  bVar2 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>::empty
                    (&(local_1f0->expression_dependencies).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>);
  if (bVar2) {
    ::std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::erase(&(this->super_CompilerGLSL).super_Compiler.forwarded_temporaries,
            (key_type *)((long)&p_Stack_20->_M_nxt + 4));
  }
  this_local._7_1_ = 1;
  ::std::__cxx11::string::~string(local_130);
  SmallVector<unsigned_int,_8UL>::~SmallVector((SmallVector<unsigned_int,_8UL> *)local_88);
LAB_003f309a:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool CompilerMSL::emit_tessellation_access_chain(const uint32_t *ops, uint32_t length)
{
	// If this is a per-vertex output, remap it to the I/O array buffer.

	// Any object which did not go through IO flattening shenanigans will go there instead.
	// We will unflatten on-demand instead as needed, but not all possible cases can be supported, especially with arrays.

	auto *var = maybe_get_backing_variable(ops[2]);
	bool patch = false;
	bool flat_data = false;
	bool ptr_is_chain = false;
	bool multi_patch = get_execution_model() == ExecutionModelTessellationControl && msl_options.multi_patch_workgroup;

	if (var)
	{
		patch = has_decoration(ops[2], DecorationPatch) || is_patch_block(get_variable_data_type(*var));

		// Should match strip_array in add_interface_block.
		flat_data = var->storage == StorageClassInput ||
		            (var->storage == StorageClassOutput && get_execution_model() == ExecutionModelTessellationControl);

		// We might have a chained access chain, where
		// we first take the access chain to the control point, and then we chain into a member or something similar.
		// In this case, we need to skip gl_in/gl_out remapping.
		ptr_is_chain = var->self != ID(ops[2]);
	}

	BuiltIn bi_type = BuiltIn(get_decoration(ops[2], DecorationBuiltIn));
	if (var && flat_data && !patch &&
	    (!is_builtin_variable(*var) || bi_type == BuiltInPosition || bi_type == BuiltInPointSize ||
	     bi_type == BuiltInClipDistance || bi_type == BuiltInCullDistance ||
	     get_variable_data_type(*var).basetype == SPIRType::Struct))
	{
		AccessChainMeta meta;
		SmallVector<uint32_t> indices;
		uint32_t next_id = ir.increase_bound_by(1);

		indices.reserve(length - 3 + 1);

		uint32_t first_non_array_index = ptr_is_chain ? 3 : 4;
		VariableID stage_var_id = var->storage == StorageClassInput ? stage_in_ptr_var_id : stage_out_ptr_var_id;
		VariableID ptr = ptr_is_chain ? VariableID(ops[2]) : stage_var_id;
		if (!ptr_is_chain)
		{
			// Index into gl_in/gl_out with first array index.
			indices.push_back(ops[3]);
		}

		auto &result_ptr_type = get<SPIRType>(ops[0]);

		uint32_t const_mbr_id = next_id++;
		uint32_t index = get_extended_decoration(var->self, SPIRVCrossDecorationInterfaceMemberIndex);
		if (var->storage == StorageClassInput || has_decoration(get_variable_element_type(*var).self, DecorationBlock))
		{
			uint32_t i = first_non_array_index;
			auto *type = &get_variable_element_type(*var);
			if (index == uint32_t(-1) && length >= (first_non_array_index + 1))
			{
				// Maybe this is a struct type in the input class, in which case
				// we put it as a decoration on the corresponding member.
				index = get_extended_member_decoration(var->self, get_constant(ops[first_non_array_index]).scalar(),
				                                       SPIRVCrossDecorationInterfaceMemberIndex);
				assert(index != uint32_t(-1));
				i++;
				type = &get<SPIRType>(type->member_types[get_constant(ops[first_non_array_index]).scalar()]);
			}

			// In this case, we're poking into flattened structures and arrays, so now we have to
			// combine the following indices. If we encounter a non-constant index,
			// we're hosed.
			for (; i < length; ++i)
			{
				if ((multi_patch || (!is_array(*type) && !is_matrix(*type))) && type->basetype != SPIRType::Struct)
					break;

				auto *c = maybe_get<SPIRConstant>(ops[i]);
				if (!c || c->specialization)
					SPIRV_CROSS_THROW("Trying to dynamically index into an array interface variable in tessellation. "
					                  "This is currently unsupported.");

				// We're in flattened space, so just increment the member index into IO block.
				// We can only do this once in the current implementation, so either:
				// Struct, Matrix or 1-dimensional array for a control point.
				index += c->scalar();

				if (type->parent_type)
					type = &get<SPIRType>(type->parent_type);
				else if (type->basetype == SPIRType::Struct)
					type = &get<SPIRType>(type->member_types[c->scalar()]);
			}

			if ((!multi_patch && (is_matrix(result_ptr_type) || is_array(result_ptr_type))) ||
			    result_ptr_type.basetype == SPIRType::Struct)
			{
				// We're not going to emit the actual member name, we let any further OpLoad take care of that.
				// Tag the access chain with the member index we're referencing.
				set_extended_decoration(ops[1], SPIRVCrossDecorationInterfaceMemberIndex, index);
			}
			else
			{
				// Access the appropriate member of gl_in/gl_out.
				set<SPIRConstant>(const_mbr_id, get_uint_type_id(), index, false);
				indices.push_back(const_mbr_id);

				// Append any straggling access chain indices.
				if (i < length)
					indices.insert(indices.end(), ops + i, ops + length);
			}
		}
		else
		{
			assert(index != uint32_t(-1));
			set<SPIRConstant>(const_mbr_id, get_uint_type_id(), index, false);
			indices.push_back(const_mbr_id);

			indices.insert(indices.end(), ops + 4, ops + length);
		}

		// We use the pointer to the base of the input/output array here,
		// so this is always a pointer chain.
		string e;

		if (!ptr_is_chain)
		{
			// This is the start of an access chain, use ptr_chain to index into control point array.
			e = access_chain(ptr, indices.data(), uint32_t(indices.size()), result_ptr_type, &meta, true);
		}
		else
		{
			// If we're accessing a struct, we need to use member indices which are based on the IO block,
			// not actual struct type, so we have to use a split access chain here where
			// first path resolves the control point index, i.e. gl_in[index], and second half deals with
			// looking up flattened member name.

			// However, it is possible that we partially accessed a struct,
			// by taking pointer to member inside the control-point array.
			// For this case, we fall back to a natural access chain since we have already dealt with remapping struct members.
			// One way to check this here is if we have 2 implied read expressions.
			// First one is the gl_in/gl_out struct itself, then an index into that array.
			// If we have traversed further, we use a normal access chain formulation.
			auto *ptr_expr = maybe_get<SPIRExpression>(ptr);
			if (ptr_expr && ptr_expr->implied_read_expressions.size() == 2)
			{
				e = join(to_expression(ptr),
				         access_chain_internal(stage_var_id, indices.data(), uint32_t(indices.size()),
				                               ACCESS_CHAIN_CHAIN_ONLY_BIT, &meta));
			}
			else
			{
				e = access_chain_internal(ptr, indices.data(), uint32_t(indices.size()), 0, &meta);
			}
		}

		// Get the actual type of the object that was accessed. If it's a vector type and we changed it,
		// then we'll need to add a swizzle.
		// For this, we can't necessarily rely on the type of the base expression, because it might be
		// another access chain, and it will therefore already have the "correct" type.
		auto *expr_type = &get_variable_data_type(*var);
		if (has_extended_decoration(ops[2], SPIRVCrossDecorationTessIOOriginalInputTypeID))
			expr_type = &get<SPIRType>(get_extended_decoration(ops[2], SPIRVCrossDecorationTessIOOriginalInputTypeID));
		for (uint32_t i = 3; i < length; i++)
		{
			if (!is_array(*expr_type) && expr_type->basetype == SPIRType::Struct)
				expr_type = &get<SPIRType>(expr_type->member_types[get<SPIRConstant>(ops[i]).scalar()]);
			else
				expr_type = &get<SPIRType>(expr_type->parent_type);
		}
		if (!is_array(*expr_type) && !is_matrix(*expr_type) && expr_type->basetype != SPIRType::Struct &&
		    expr_type->vecsize > result_ptr_type.vecsize)
			e += vector_swizzle(result_ptr_type.vecsize, 0);

		auto &expr = set<SPIRExpression>(ops[1], move(e), ops[0], should_forward(ops[2]));
		expr.loaded_from = var->self;
		expr.need_transpose = meta.need_transpose;
		expr.access_chain = true;

		// Mark the result as being packed if necessary.
		if (meta.storage_is_packed)
			set_extended_decoration(ops[1], SPIRVCrossDecorationPhysicalTypePacked);
		if (meta.storage_physical_type != 0)
			set_extended_decoration(ops[1], SPIRVCrossDecorationPhysicalTypeID, meta.storage_physical_type);
		if (meta.storage_is_invariant)
			set_decoration(ops[1], DecorationInvariant);
		// Save the type we found in case the result is used in another access chain.
		set_extended_decoration(ops[1], SPIRVCrossDecorationTessIOOriginalInputTypeID, expr_type->self);

		// If we have some expression dependencies in our access chain, this access chain is technically a forwarded
		// temporary which could be subject to invalidation.
		// Need to assume we're forwarded while calling inherit_expression_depdendencies.
		forwarded_temporaries.insert(ops[1]);
		// The access chain itself is never forced to a temporary, but its dependencies might.
		suppressed_usage_tracking.insert(ops[1]);

		for (uint32_t i = 2; i < length; i++)
		{
			inherit_expression_dependencies(ops[1], ops[i]);
			add_implied_read_expression(expr, ops[i]);
		}

		// If we have no dependencies after all, i.e., all indices in the access chain are immutable temporaries,
		// we're not forwarded after all.
		if (expr.expression_dependencies.empty())
			forwarded_temporaries.erase(ops[1]);

		return true;
	}

	// If this is the inner tessellation level, and we're tessellating triangles,
	// drop the last index. It isn't an array in this case, so we can't have an
	// array reference here. We need to make this ID a variable instead of an
	// expression so we don't try to dereference it as a variable pointer.
	// Don't do this if the index is a constant 1, though. We need to drop stores
	// to that one.
	auto *m = ir.find_meta(var ? var->self : ID(0));
	if (get_execution_model() == ExecutionModelTessellationControl && var && m &&
	    m->decoration.builtin_type == BuiltInTessLevelInner && get_entry_point().flags.get(ExecutionModeTriangles))
	{
		auto *c = maybe_get<SPIRConstant>(ops[3]);
		if (c && c->scalar() == 1)
			return false;
		auto &dest_var = set<SPIRVariable>(ops[1], *var);
		dest_var.basetype = ops[0];
		ir.meta[ops[1]] = ir.meta[ops[2]];
		inherit_expression_dependencies(ops[1], ops[2]);
		return true;
	}

	return false;
}